

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O1

string * __thiscall
glu::getProgramInfoLog_abi_cxx11_
          (string *__return_storage_ptr__,glu *this,Functions *gl,deUint32 program)

{
  char cVar1;
  pointer pcVar2;
  deUint32 err;
  size_t sVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  char *pcVar5;
  vector<char,_std::allocator<char>_> infoLog;
  int unusedLen;
  int infoLogLen;
  allocator_type local_42;
  value_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  undefined1 local_28 [4];
  int local_24;
  
  local_24 = 0;
  (**(code **)(this + 0x9d8))
            ((ulong)gl & 0xffffffff,0x8b84,&local_24,CONCAT44(in_register_0000000c,program));
  err = (**(code **)(this + 0x800))();
  checkError(err,"glGetProgramiv()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x98);
  if (local_24 < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_41 = '\0';
    std::vector<char,_std::allocator<char>_>::vector
              (&local_40,(long)(local_24 + 3),&local_41,&local_42);
    (**(code **)(this + 0x988))
              ((ulong)gl & 0xffffffff,
               ~(uint)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
               (int)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish,local_28);
    pcVar2 = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = CONCAT44(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_,
                     (int)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
            (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    cVar1 = local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start[(int)lVar4 + -1];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (cVar1 == '\0') {
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start == (char *)0x0) {
        pcVar5 = &DAT_00000001;
      }
      else {
        sVar3 = strlen(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start);
        pcVar5 = pcVar2 + sVar3;
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar5);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,
                 local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar4);
    }
    if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getProgramInfoLog (const glw::Functions& gl, deUint32 program)
{
	int infoLogLen = 0;
	int unusedLen;

	gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLen);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv()");

	if (infoLogLen > 0)
	{
		// The INFO_LOG_LENGTH query and the buffer query implementations have
		// very commonly off-by-one errors. Try to work around these issues.

		// add tolerance for off-by-one in log length, buffer write, and for terminator
		std::vector<char> infoLog(infoLogLen + 3, '\0');

		// claim buf size is one smaller to protect from off-by-one writing over buffer bounds
		gl.getProgramInfoLog(program, (int)infoLog.size() - 1, &unusedLen, &infoLog[0]);

		// return whole buffer if null terminator was overwritten
		if (infoLog[(int)(infoLog.size()) - 1] != '\0')
			return std::string(&infoLog[0], infoLog.size());

		// read as C string. infoLog is guaranteed to be 0-terminated
		return std::string(&infoLog[0]);
	}
	return std::string();
}